

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O0

bool __thiscall MyGame::Example::Stat::Verify(Stat *this,Verifier *verifier)

{
  bool bVar1;
  String *str;
  undefined1 local_19;
  Verifier *verifier_local;
  Stat *this_local;
  
  bVar1 = flatbuffers::Table::VerifyTableStart(&this->super_Table,verifier);
  local_19 = false;
  if (bVar1) {
    bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,4);
    local_19 = false;
    if (bVar1) {
      str = id(this);
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,str);
      local_19 = false;
      if (bVar1) {
        bVar1 = flatbuffers::Table::VerifyField<long>(&this->super_Table,verifier,6,8);
        local_19 = false;
        if (bVar1) {
          bVar1 = flatbuffers::Table::VerifyField<unsigned_short>(&this->super_Table,verifier,8,2);
          local_19 = false;
          if (bVar1) {
            local_19 = flatbuffers::VerifierTemplate<false>::EndTable(verifier);
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffset(verifier, VT_ID) &&
           verifier.VerifyString(id()) &&
           VerifyField<int64_t>(verifier, VT_VAL, 8) &&
           VerifyField<uint16_t>(verifier, VT_COUNT, 2) &&
           verifier.EndTable();
  }